

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::inputdialog(uint argc)

{
  CCharmapToUni *pCVar1;
  CVmConsoleMain *this;
  int iVar2;
  int iVar3;
  int default_index;
  int cancel_index;
  int iVar4;
  uint uVar5;
  ushort *puVar6;
  size_t __n;
  size_t sVar7;
  long lVar8;
  vm_val_t *this_00;
  vm_val_t *pvVar9;
  char *dst;
  size_t dstrem;
  uint local_3b4;
  int local_3b0;
  int evt;
  char numbuf [32];
  char *labels [10];
  char label_buf [256];
  vm_val_t label_val [10];
  char prompt [256];
  
  CVmBif::check_argc(argc,5);
  local_3b0 = CVmBif::pop_int_val();
  CVmBif::pop_str_val_ui(prompt,0x100);
  if (sp_[-1].typ == VM_INT) {
    iVar3 = 0;
    iVar2 = CVmBif::pop_int_val();
  }
  else {
    iVar2 = vm_val_t::is_listlike(sp_ + -1);
    if (iVar2 == 0) {
LAB_00231357:
      err_throw(0x900);
    }
    local_3b4 = vm_val_t::ll_length(sp_ + -1);
    if ((int)local_3b4 < 0) goto LAB_00231357;
    uVar5 = 10;
    if (local_3b4 < 10) {
      uVar5 = local_3b4;
    }
    if (local_3b4 != 0) {
      this_00 = sp_ + -1;
      iVar2 = 1;
      pvVar9 = label_val;
      do {
        label_buf[0] = '\a';
        label_buf[1] = '\0';
        label_buf[2] = '\0';
        label_buf[3] = '\0';
        label_buf._8_4_ = iVar2;
        vm_val_t::ll_index(this_00,pvVar9,(vm_val_t *)label_buf);
        pvVar9 = pvVar9 + 1;
        iVar3 = (1 - uVar5) + iVar2;
        iVar2 = iVar2 + 1;
      } while (iVar3 != 1);
    }
    sp_ = sp_ + -1;
    dst = label_buf;
    dstrem = 0x100;
    if (local_3b4 == 0) {
      iVar3 = 0;
      iVar2 = 0;
    }
    else {
      pvVar9 = label_val;
      iVar3 = 0;
      do {
        puVar6 = (ushort *)vm_val_t::get_as_string(pvVar9);
        if (puVar6 == (ushort *)0x0) {
          if ((pvVar9->typ == VM_INT) && (0xfffffffb < (pvVar9->val).intval - 5U)) {
            iVar2 = os_get_str_rsc((pvVar9->val).intval,numbuf,0x80);
            pCVar1 = G_cmap_from_ui_X;
            if (iVar2 == 0) {
              lVar8 = (long)iVar3;
              iVar3 = iVar3 + 1;
              labels[lVar8] = dst;
              sVar7 = strlen(numbuf);
              (*(pCVar1->super_CCharmap)._vptr_CCharmap[4])(pCVar1,&dst,&dstrem,numbuf,sVar7);
              *dst = '\0';
              dstrem = dstrem - 1;
              dst = dst + 1;
            }
          }
        }
        else {
          __n = (size_t)*puVar6;
          if (dstrem - 1 < __n) {
            __n = utf8_ptr::s_trunc((char *)(puVar6 + 1),dstrem - 1);
          }
          memcpy(dst,puVar6 + 1,__n);
          dst[__n] = '\0';
          lVar8 = (long)iVar3;
          iVar3 = iVar3 + 1;
          labels[lVar8] = dst;
          dstrem = dstrem - (__n + 1);
          dst = dst + __n + 1;
        }
        pvVar9 = pvVar9 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      iVar2 = 0;
    }
  }
  if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    default_index = 0;
  }
  else {
    default_index = CVmBif::pop_int_val();
  }
  if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    cancel_index = 0;
  }
  else {
    cancel_index = CVmBif::pop_int_val();
  }
  iVar4 = CVmConsole::read_event_script
                    (&G_console_X->super_CVmConsole,&evt,numbuf,0x20,inputdialog::filter,1,
                     (unsigned_long *)0x0);
  if (iVar4 == 0) {
    if (G_net_config_X != (TadsNetConfig *)0x0) {
      lVar8 = 0;
      goto LAB_002312e1;
    }
    iVar4 = 1;
    (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,1);
    uVar5 = CVmConsole::input_dialog
                      (&G_console_X->super_CVmConsole,local_3b0,prompt,iVar2,labels,iVar3,
                       default_index,cancel_index,0);
    sprintf(numbuf,"%d",(ulong)uVar5);
  }
  else {
    uVar5 = atoi(numbuf);
    iVar4 = 0;
  }
  this = G_console_X;
  sVar7 = strlen(numbuf);
  CVmConsole::log_event(&this->super_CVmConsole,0x2711,numbuf,sVar7,iVar4);
  lVar8 = (long)(int)uVar5;
LAB_002312e1:
  CVmBif::retval_int(lVar8);
  return;
}

Assistant:

void CVmBifTIO::inputdialog(VMG_ uint argc)
{
    int icon_id;
    char prompt[256];
    char label_buf[256];
    vm_val_t label_val[10];
    const char *labels[10];
    int lst_cnt;
    int std_btns;
    int btn_cnt;
    char *dst;
    size_t dstrem;
    int default_resp;
    int cancel_resp;
    int resp;
    char numbuf[32];
    
    /* check arguments */
    check_argc(vmg_ argc, 5);

    /* get the icon number */
    icon_id = pop_int_val(vmg0_);

    /* get the prompt string */
    pop_str_val_ui(vmg_ prompt, sizeof(prompt));

    /* there aren't any buttons yet */
    btn_cnt = 0;

    /* check for the button type */
    if (G_stk->get(0)->typ == VM_INT)
    {
        /* get the standard button set ID */
        std_btns = pop_int_val(vmg0_);
    }
    else if (G_stk->get(0)->is_listlike(vmg0_)
             && (lst_cnt = G_stk->get(0)->ll_length(vmg0_)) >= 0)
    {
        int i;
        vm_val_t *valp;
        
        /* we're not using any standard button set */
        std_btns = 0;

        /* 
         *   run through the list and get the button items into our array
         *   (we do this rather than traversing the list directly so that
         *   we don't have to worry about a constant list's data being
         *   paged out) 
         */
        vm_val_t *lst = G_stk->get(0);

		/* limit the number of elements to our private array size */
		if ((size_t)lst_cnt > sizeof(label_val)/sizeof(label_val[0]))
            lst_cnt = sizeof(label_val)/sizeof(label_val[0]);

        /* copy the list */
        for (i = 1, valp = label_val ; i <= lst_cnt ; ++i, ++valp)
            lst->ll_index(vmg_ valp, i);

        /* done with the list - discard it */
        G_stk->discard();

        /* set up to write into our label buffer */
        dst = label_buf;
        dstrem = sizeof(label_buf);

        /* now build our internal button list from the array elements */
        for (i = 0, valp = label_val ; i < lst_cnt ; ++i, ++valp)
        {
            const char *p;

            /* 
             *   We could have a number or a string in each element.  If
             *   the element is a number, it refers to a standard label.
             *   If it's a string, use the string directly. 
             */
            if ((p = valp->get_as_string(vmg0_)) != 0)
            {
                size_t copy_len;
                
                /* 
                 *   it's a string - make a copy in the label buffer,
                 *   making sure to leave space for null termination 
                 */
                copy_len = vmb_get_len(p);
                if (copy_len > dstrem - 1)
                    copy_len = utf8_ptr::s_trunc(p + VMB_LEN, dstrem - 1);
                memcpy(dst, p + VMB_LEN, copy_len);

                /* null-terminate the buffer */
                dst[copy_len++] = '\0';

                /* set this button to point to the converted text */
                labels[btn_cnt++] = dst;

                /* skip past this label */
                dst += copy_len;
                dstrem -= copy_len;
            }
            else if (valp->typ == VM_INT)
            {
                int id;
                int resid;
                char rscbuf[128];
                
                /* it's a standard system label ID - get the ID */
                id = (int)valp->val.intval;

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = VMRESID_BTN_OK;
                    break;

                case BIFINPDLG_LBL_CANCEL:
                    resid = VMRESID_BTN_CANCEL;
                    break;

                case BIFINPDLG_LBL_YES:
                    resid = VMRESID_BTN_YES;
                    break;

                case BIFINPDLG_LBL_NO:
                    resid = VMRESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button 
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, rscbuf, sizeof(rscbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[btn_cnt++] = dst;

                    /* convert the resource text to UTF-8 */
                    G_cmap_from_ui->map(&dst, &dstrem,
                                        rscbuf, strlen(rscbuf));

                    /* null-terminate the converted text */
                    *dst++ = '\0';
                    --dstrem;
                }
            }
        }
    }
    else
    {
        /* invalid button type */
        err_throw(VMERR_BAD_TYPE_BIF);
    }